

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_addLinearObjective
                   (void *highs,double weight,double offset,double *coefficients,
                   double abs_tolerance,double rel_tolerance,HighsInt priority)

{
  HighsStatus HVar1;
  ulong uVar2;
  bool bVar3;
  HighsLinearObjective linear_objective;
  
  linear_objective.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linear_objective.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  linear_objective.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  linear_objective.weight = weight;
  linear_objective.offset = offset;
  if (0 < (int)*(uint *)((long)highs + 0x138)) {
    uVar2 = (ulong)*(uint *)((long)highs + 0x138);
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&linear_objective.coefficients,coefficients);
    coefficients = coefficients + 1;
  }
  linear_objective.weight = weight;
  linear_objective.abs_tolerance = abs_tolerance;
  linear_objective.rel_tolerance = rel_tolerance;
  linear_objective.priority = priority;
  HVar1 = Highs::addLinearObjective((Highs *)highs,&linear_objective,-1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&linear_objective.coefficients.super__Vector_base<double,_std::allocator<double>_>);
  return HVar1;
}

Assistant:

HighsInt Highs_addLinearObjective(const void* highs, const double weight,
                                  const double offset,
                                  const double* coefficients,
                                  const double abs_tolerance,
                                  const double rel_tolerance,
                                  const HighsInt priority) {
  HighsLinearObjective linear_objective;
  HighsInt num_col = Highs_getNumCol(highs);
  linear_objective.weight = weight;
  linear_objective.offset = offset;
  for (HighsInt iCol = 0; iCol < num_col; iCol++)
    linear_objective.coefficients.push_back(coefficients[iCol]);
  linear_objective.abs_tolerance = abs_tolerance;
  linear_objective.rel_tolerance = rel_tolerance;
  linear_objective.priority = priority;
  linear_objective.weight = weight;
  return HighsInt(((Highs*)highs)->addLinearObjective(linear_objective));
}